

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringCacheAllocator_allocationIsCached_TestShell::
~TEST_SimpleStringCacheAllocator_allocationIsCached_TestShell
          (TEST_SimpleStringCacheAllocator_allocationIsCached_TestShell *this)

{
  TEST_SimpleStringCacheAllocator_allocationIsCached_TestShell *this_local;
  
  ~TEST_SimpleStringCacheAllocator_allocationIsCached_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleStringCacheAllocator, allocationIsCached)
{
    char* mem = allocator->alloc_memory(10, __FILE__, __LINE__);
    allocator->free_memory(mem, 10,  __FILE__, __LINE__);

    size_t totalAllocations = accountant.totalAllocations();
    size_t totalDeallocations = accountant.totalDeallocations();

    mem = allocator->alloc_memory(10, __FILE__, __LINE__);
    allocator->free_memory(mem, 10,  __FILE__, __LINE__);

    LONGS_EQUAL(totalAllocations, accountant.totalAllocations());
    LONGS_EQUAL(totalDeallocations, accountant.totalDeallocations());
}